

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall
LowererMD::Simd128CanonicalizeToBools(LowererMD *this,Instr *instr,OpCode *cmpOpcode,Opnd *dstOpnd)

{
  OpCode opcode;
  code *pcVar1;
  bool bVar2;
  intptr_t iVar3;
  MemRefOpnd *pMVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  uint uVar7;
  
  uVar7 = instr->m_opcode - 0x3b9;
  if (((0x19 < uVar7) || ((0x39c2709U >> (uVar7 & 0x1f) & 1) == 0)) && (1 < instr->m_opcode - 0x2d3)
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x1d4,
                       "(instr->m_opcode == Js::OpCode::Simd128_IntsToB4 || instr->m_opcode == Js::OpCode::Simd128_IntsToB8 || instr->m_opcode == Js::OpCode::Simd128_IntsToB16 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B8 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B16 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B16 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B16)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_IntsToB4 || instr->m_opcode == Js::OpCode::Simd128_IntsToB8 || instr->m_opcode == Js::OpCode::Simd128_IntsToB16 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B8 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B16 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B16 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B16"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  opcode = *cmpOpcode;
  iVar3 = ThreadContextInfo::GetX86AllZerosAddr(this->m_func->m_threadContextInfo);
  pMVar4 = IR::MemRefOpnd::New(iVar3,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar5 = IR::Instr::New(opcode,dstOpnd,dstOpnd,&pMVar4->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  Legalize<false>(pIVar5,false);
  iVar3 = ThreadContextInfo::GetX86AllNegOnesAddr(this->m_func->m_threadContextInfo);
  pMVar4 = IR::MemRefOpnd::New(iVar3,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar5 = IR::Instr::New(PANDN,dstOpnd,dstOpnd,&pMVar4->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  Legalize<false>(pIVar5,false);
  return instr;
}

Assistant:

IR::Instr* LowererMD::Simd128CanonicalizeToBools(IR::Instr* instr, const Js::OpCode &cmpOpcode, IR::Opnd& dstOpnd)
{
    Assert(instr->m_opcode == Js::OpCode::Simd128_IntsToB4 || instr->m_opcode == Js::OpCode::Simd128_IntsToB8 || instr->m_opcode == Js::OpCode::Simd128_IntsToB16 ||
           instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B8 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B16 ||
           instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B16 ||
           instr->m_opcode == Js::OpCode::Simd128_AllTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B16
    );
    IR::Instr *pInstr;
    //dst = cmpOpcode dst, X86_ALL_ZEROS
    pInstr = IR::Instr::New(cmpOpcode, &dstOpnd, &dstOpnd, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AllZerosAddr(), TySimd128I4, m_func), m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);
    // dst = PANDN dst, X86_ALL_NEG_ONES
    pInstr = IR::Instr::New(Js::OpCode::PANDN, &dstOpnd, &dstOpnd, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AllNegOnesAddr(), TySimd128I4, m_func), m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);
    return instr;
}